

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.h
# Opt level: O0

bool __thiscall
axl::xml::ExpatParserRoot::complete<bool>(ExpatParserRoot *this,bool result,bool failResult)

{
  byte in_DL;
  byte in_SIL;
  ExpatParserRoot *in_stack_00000008;
  
  if ((in_SIL & 1) == (in_DL & 1)) {
    getLastError(in_stack_00000008);
    err::setError((ErrorRef *)0x1521e8);
    err::Error::~Error((Error *)0x1521f4);
  }
  return (bool)(in_SIL & 1);
}

Assistant:

T
	complete(
		T result,
		T failResult
	) {
		if (result == failResult)
			err::setError(getLastError());

		return result;
	}